

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::request_prevote(raft_server *this)

{
  atomic<int> *paVar1;
  uint uVar2;
  element_type *peVar3;
  __int_type _Var4;
  element_type *peVar5;
  undefined1 auVar6 [16];
  element_type *peVar7;
  bool bVar8;
  int iVar9;
  int32 iVar10;
  int iVar11;
  uint64_t uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int iVar14;
  srv_role _role;
  __node_base *p_Var15;
  __node_base *p_Var16;
  ptr<raft_params> clone;
  ptr<srv_config> s_config;
  ptr<peer> pp;
  int32 local_80;
  int local_7c;
  ptr<raft_params> params;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  element_type *local_58;
  ptr<cluster_config> c_config;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  nuraft::context::get_params((context *)&params);
  get_config((raft_server *)&c_config);
  p_Var15 = &(this->peers_)._M_h._M_before_begin;
  p_Var16 = p_Var15;
  while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var16 + 2));
    bVar8 = is_regular_member(this,(ptr<peer> *)
                                   &pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
    ;
    if (bVar8) {
      cluster_config::get_server
                ((cluster_config *)&s_config,
                 (int)c_config.
                      super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (((this->hb_alive_)._M_base._M_i & 1U) == 0) {
          bVar8 = peer::need_to_reconnect
                            (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          uVar12 = timer_helper::get_us
                             (&(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->last_active_timer_);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar12;
          if (SUB164(auVar6 / ZEXT816(1000),0) <=
              DAT_005e29d0 *
              (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              heart_beat_interval_) {
            if (!bVar8) goto LAB_001cffec;
            goto LAB_001cfea0;
          }
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar3 != (element_type *)0x0) {
            iVar9 = (*peVar3->_vptr_logger[7])();
            if (2 < iVar9) {
              peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)&clone,
                         "connection to peer %d is not active long time: %d ms, need reconnection for prevote"
                         ,(ulong)(uint)(((pp.
                                          super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->config_).
                                        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->id_,SUB168(auVar6 / ZEXT816(1000),0) & 0xffffffff);
              (*peVar3->_vptr_logger[8])
                        (peVar3,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"request_prevote",0x49,(string *)&clone);
              std::__cxx11::string::~string((string *)&clone);
            }
            goto LAB_001cfea0;
          }
        }
        else {
LAB_001cfea0:
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 3 < iVar9))
          {
            peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&clone,"reset RPC client for peer %d",
                       (ulong)(uint)(s_config.
                                     super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id_);
            (*peVar3->_vptr_logger[8])
                      (peVar3,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"request_prevote",0x4f,(string *)&clone);
            std::__cxx11::string::~string((string *)&clone);
          }
        }
        peer::recreate_rpc(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &s_config,
                           (this->ctx_)._M_t.
                           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                           .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl);
      }
LAB_001cffec:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  iVar10 = get_quorum_for_election(this);
  iVar9 = (this->pre_vote_).live_.super___atomic_base<int>._M_i;
  iVar11 = (this->pre_vote_).dead_.super___atomic_base<int>._M_i;
  iVar14 = iVar11 + iVar9;
  if (iVar14 != 0 && SCARRY4(iVar11,iVar9) == iVar14 < 0) {
    if (iVar10 < (this->pre_vote_).dead_.super___atomic_base<int>._M_i +
                 (this->pre_vote_).live_.super___atomic_base<int>._M_i) {
      LOCK();
      (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i = 0;
      UNLOCK();
    }
    else {
      LOCK();
      paVar1 = &(this->pre_vote_).failure_count_;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 2 < iVar9)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "total %d nodes (including this node) responded for pre-vote (term %lu, live %d, dead %d), at least %d nodes should respond. failure count %d"
                   ,(ulong)(uint)((this->pre_vote_).dead_.super___atomic_base<int>._M_i +
                                 (this->pre_vote_).live_.super___atomic_base<int>._M_i),
                   (this->pre_vote_).term_,
                   (ulong)(uint)(this->pre_vote_).live_.super___atomic_base<int>._M_i,
                   (ulong)(uint)(this->pre_vote_).dead_.super___atomic_base<int>._M_i,
                   (ulong)(iVar10 + 1),
                   (ulong)(uint)(this->pre_vote_).failure_count_.super___atomic_base<int>._M_i);
        (*peVar3->_vptr_logger[8])
                  (peVar3,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"request_prevote",0x62,&clone);
        std::__cxx11::string::~string((string *)&clone);
      }
    }
  }
  iVar10 = get_num_voting_members(this);
  if (((iVar10 == 2) &&
      ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       auto_adjust_quorum_for_small_cluster_ != false)) &&
     (_DAT_005e29d8 < (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i)) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 2 < iVar9)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&clone,
                 "2-node cluster\'s pre-vote is failing long time, adjust quorum to 1");
      (*peVar3->_vptr_logger[8])
                (peVar3,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"request_prevote",0x6d,&clone);
      std::__cxx11::string::~string((string *)&clone);
    }
    std::make_shared<nuraft::raft_params,nuraft::raft_params&>((raft_params *)&clone);
    (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    custom_commit_quorum_size_ = 1;
    (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    custom_election_quorum_size_ = 1;
    nuraft::context::set_params
              ((this->ctx_)._M_t.
               super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
               super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
               super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,&clone);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  LOCK();
  (this->hb_alive_)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->leader_).super___atomic_base<int>._M_i = -1;
  UNLOCK();
  LOCK();
  (this->role_)._M_i = candidate;
  UNLOCK();
  (this->pre_vote_).term_ =
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (this->pre_vote_).done_._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).dead_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).live_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  paVar1 = &(this->pre_vote_).dead_;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  if (this->my_priority_ < this->target_priority_) {
    bVar8 = check_cond_for_zp_election(this);
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!bVar8) {
      if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 3 < iVar9)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "[PRIORITY] will not initiate pre-vote due to priority: target %d, mine %d",
                   (ulong)(uint)this->target_priority_,(ulong)(uint)this->my_priority_);
        (*peVar3->_vptr_logger[8])
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"request_prevote",0x80,&clone);
        std::__cxx11::string::~string((string *)&clone);
      }
      restart_election_timer(this);
      goto LAB_001d05c9;
    }
    if (peVar3 != (element_type *)0x0) {
      iVar9 = (*peVar3->_vptr_logger[7])();
      if (3 < iVar9) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,"[PRIORITY] temporarily allow election for zero-priority member"
                  );
        (*peVar3->_vptr_logger[8])
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"request_prevote",0x7d,&clone);
        std::__cxx11::string::~string((string *)&clone);
      }
      goto LAB_001d0284;
    }
  }
  else {
LAB_001d0284:
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 3 < iVar9)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar2 = this->id_;
      srv_role_to_string_abi_cxx11_((string *)&pp,(nuraft *)(ulong)(this->role_)._M_i,_role);
      peVar7 = pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var4 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
      iVar9 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      iVar11 = (*((this->log_store_).
                  super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_log_store[2])();
      uVar13 = term_for_log(this,CONCAT44(extraout_var_00,iVar11) - 1);
      msg_if_given_abi_cxx11_
                ((string *)&clone,
                 "[PRE-VOTE INIT] my id %d, my role %s, term %lu, log idx %lu, log term %lu, priority (target %d / mine %d)\n"
                 ,(ulong)uVar2,peVar7,_Var4,CONCAT44(extraout_var,iVar9) + -1,uVar13,
                 (ulong)(uint)this->target_priority_,(ulong)(uint)this->my_priority_);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"request_prevote",0x8b,&clone);
      std::__cxx11::string::~string((string *)&clone);
      std::__cxx11::string::~string((string *)&pp);
    }
  }
  while( true ) {
    p_Var15 = p_Var15->_M_nxt;
    if (p_Var15 == (__node_base *)0x0) break;
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var15 + 2));
    bVar8 = is_regular_member(this,(ptr<peer> *)
                                   &pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
    ;
    if (bVar8) {
      clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->term_).super___atomic_base<unsigned_long>._M_i;
      local_7c = 0x14;
      local_80 = (((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_
                  ).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
      iVar9 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      local_58 = (element_type *)term_for_log(this,CONCAT44(extraout_var_01,iVar9) - 1);
      iVar9 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      local_60._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(CONCAT44(extraout_var_02,iVar9) + -1);
      std::
      make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long>
                ((unsigned_long *)&s_config,(msg_type *)&clone,&local_7c,&this->id_,
                 (unsigned_long *)&local_80,(unsigned_long *)&local_58,(unsigned_long *)&local_60);
      bVar8 = peer::make_busy(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             );
      peVar7 = pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (bVar8) {
        std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
        peer::send_req(peVar7,(ptr<peer> *)&local_40,(ptr<req_msg> *)&s_config,&this->resp_handler_)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
      else {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar3 != (element_type *)0x0) && (iVar9 = (*peVar3->_vptr_logger[7])(), 2 < iVar9)) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar5 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&clone,"failed to send prevote request: peer %d (%s) is busy",
                     (ulong)(uint)peVar5->id_,(peVar5->endpoint_)._M_dataplus._M_p);
          (*peVar3->_vptr_logger[8])
                    (peVar3,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"request_prevote",0xa0,(string *)&clone);
          std::__cxx11::string::~string((string *)&clone);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
LAB_001d05c9:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void raft_server::request_prevote() {
    ptr<raft_params> params = ctx_->get_params();
    ptr<cluster_config> c_config = get_config();
    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) continue;
        ptr<srv_config> s_config = c_config->get_server( pp->get_id() );

        if (s_config) {
            bool recreate = false;
            if (hb_alive_) {
                // First pre-vote request: reset RPC client for all peers.
                recreate = true;

            } else {
                // Since second time: reset only if `rpc_` is null.
                recreate = pp->need_to_reconnect();

                // Or if it is not active long time, reconnect as well.
                int32 last_active_time_ms = pp->get_active_timer_us() / 1000;
                if ( last_active_time_ms >
                         params->heart_beat_interval_ *
                             raft_server::raft_limits_.reconnect_limit_ ) {
                    p_wn( "connection to peer %d is not active long time: %d ms, "
                          "need reconnection for prevote",
                          pp->get_id(),
                          last_active_time_ms );
                    recreate = true;
                }
            }

            if (recreate) {
                p_in("reset RPC client for peer %d", s_config->get_id());
                pp->recreate_rpc(s_config, *ctx_);
            }
        }
    }

    int quorum_size = get_quorum_for_election();
    if (pre_vote_.live_ + pre_vote_.dead_ > 0) {
        if (pre_vote_.live_ + pre_vote_.dead_ < quorum_size + 1) {
            // Pre-vote failed due to non-responding voters.
            pre_vote_.failure_count_++;
            p_wn("total %d nodes (including this node) responded for pre-vote "
                 "(term %" PRIu64 ", live %d, dead %d), at least %d nodes should "
                 "respond. failure count %d",
                 pre_vote_.live_.load() + pre_vote_.dead_.load(),
                 pre_vote_.term_,
                 pre_vote_.live_.load(),
                 pre_vote_.dead_.load(),
                 quorum_size + 1,
                 pre_vote_.failure_count_.load());
        } else {
            pre_vote_.failure_count_ = 0;
        }
    }
    int num_voting_members = get_num_voting_members();
    if ( params->auto_adjust_quorum_for_small_cluster_ &&
         num_voting_members == 2 &&
         pre_vote_.failure_count_ > raft_server::raft_limits_.vote_limit_ ) {
        // 2-node cluster's pre-vote failed due to offline node.
        p_wn("2-node cluster's pre-vote is failing long time, "
             "adjust quorum to 1");
        ptr<raft_params> clone = cs_new<raft_params>(*params);
        clone->custom_commit_quorum_size_ = 1;
        clone->custom_election_quorum_size_ = 1;
        ctx_->set_params(clone);
    }

    hb_alive_ = false;
    leader_ = -1;
    role_ = srv_role::candidate;
    pre_vote_.reset(state_->get_term());
    // Count for myself.
    pre_vote_.dead_++;

    if ( my_priority_ < target_priority_ ) {
        if ( check_cond_for_zp_election() ) {
            p_in("[PRIORITY] temporarily allow election for zero-priority member");
        } else {
            p_in("[PRIORITY] will not initiate pre-vote due to priority: "
                 "target %d, mine %d", target_priority_, my_priority_);
            restart_election_timer();
            return;
        }
    }

    p_in("[PRE-VOTE INIT] my id %d, my role %s, term %" PRIu64 ", log idx %" PRIu64 ", "
         "log term %" PRIu64 ", priority (target %d / mine %d)\n",
         id_, srv_role_to_string(role_).c_str(),
         state_->get_term(), log_store_->next_slot() - 1,
         term_for_log(log_store_->next_slot() - 1),
         target_priority_, my_priority_);

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) {
            // Do not send voting request to learner.
            continue;
        }

        ptr<req_msg> req( cs_new<req_msg>
                          ( state_->get_term(),
                            msg_type::pre_vote_request,
                            id_,
                            pp->get_id(),
                            term_for_log(log_store_->next_slot() - 1),
                            log_store_->next_slot() - 1,
                            quick_commit_index_.load() ) );
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_wn("failed to send prevote request: peer %d (%s) is busy",
                 pp->get_id(), pp->get_endpoint().c_str());
        }
    }
}